

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O0

void remove_tool_from_list(tool_t *target)

{
  int iVar1;
  long in_RDI;
  bool bVar2;
  tool_t *cur;
  uint7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  tool_t *in_stack_fffffffffffffff0;
  tool_t *t1;
  
  if (tools != (tool_t *)0x0) {
    iVar1 = tool_equal(in_stack_fffffffffffffff0,
                       (tool_t *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    t1 = tools;
    if (iVar1 == 0) {
      tools = tools->next_tool;
    }
    else {
      while( true ) {
        bVar2 = false;
        if ((t1 != (tool_t *)0x0) && (bVar2 = false, t1->next_tool != (tool_t *)0x0)) {
          iVar1 = tool_equal(t1,(tool_t *)(ulong)in_stack_ffffffffffffffe8);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        t1 = t1->next_tool;
      }
      iVar1 = tool_equal(t1,(tool_t *)(ulong)in_stack_ffffffffffffffe8);
      if (iVar1 == 0) {
        t1->next_tool = *(tool_t **)(in_RDI + 0x10);
      }
    }
  }
  return;
}

Assistant:

void remove_tool_from_list(struct tool_t* target){
     if(!tools){
        return;
     }
     if(!tool_equal(tools,target)){
        tools = tools->next_tool;
        return;
     }
     struct tool_t *cur = tools;
     while( (cur!=NULL) && (cur->next_tool != NULL) && (tool_equal(cur->next_tool,target))){
        cur = cur->next_tool;
     }
     if(!tool_equal(cur->next_tool,target)){
        cur->next_tool = target->next_tool; 
     }
}